

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

ON__UINT64 __thiscall
ON_SerialNumberMap::GarbageCollectMoveHelper
          (ON_SerialNumberMap *this,ON_SN_BLOCK *dst,ON_SN_BLOCK *src)

{
  SN_ELEMENT *pSVar1;
  uint uVar2;
  uint uVar3;
  ON__UINT64 OVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  MAP_VALUE *pMVar7;
  ON__UINT32 OVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  ON__UINT32 OVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  SN_ELEMENT *__src;
  
  if (dst == (ON_SN_BLOCK *)0x0 || src == (ON_SN_BLOCK *)0x0) {
    return 0;
  }
  uVar15 = (ulong)dst->m_count;
  uVar14 = 0x2000 - dst->m_count;
  uVar2 = src->m_count;
  uVar13 = uVar14;
  if (uVar2 < uVar14) {
    uVar13 = uVar2;
  }
  if (uVar13 == 0) {
    return 0;
  }
  if (uVar15 == 0) {
    dst->m_purged = 0;
    dst->m_sorted = 1;
    dst->m_sn0 = 0;
    dst->m_sn1 = 0;
  }
  if ((src->m_sorted == 0) && (dst->m_sorted = 0, uVar15 == 0)) {
    OVar4 = src->m_sn1;
    dst->m_sn0 = src->m_sn0;
    dst->m_sn1 = OVar4;
  }
  __src = src->m_sn;
  memcpy(dst->m_sn + uVar15,__src,(ulong)uVar13 * 0x38);
  OVar11 = dst->m_count + uVar13;
  dst->m_count = OVar11;
  if (dst->m_sorted == 0) {
    if (src->m_sn0 < dst->m_sn0) {
      dst->m_sn0 = src->m_sn0;
    }
    uVar15 = src->m_sn1;
    if (uVar15 <= dst->m_sn1) goto LAB_004eacbd;
  }
  else {
    dst->m_sn0 = dst->m_sn[0].m_sn;
    uVar15 = dst->m_sn[OVar11 - 1].m_sn;
  }
  dst->m_sn1 = uVar15;
LAB_004eacbd:
  uVar3 = src->m_count;
  if (uVar2 < uVar14) {
    uVar14 = uVar2;
  }
  uVar15 = (ulong)uVar14;
  for (lVar12 = 0; uVar15 + lVar12 < (ulong)uVar3; lVar12 = lVar12 + 1) {
    (__src->m_value).m_u = __src[uVar15].m_value.m_u;
    pSVar1 = __src + uVar15;
    uVar2 = (pSVar1->m_id).Data1;
    uVar9 = (pSVar1->m_id).Data2;
    uVar10 = (pSVar1->m_id).Data3;
    uVar5 = *(undefined8 *)(pSVar1->m_id).Data4;
    OVar4 = __src[uVar15].m_sn;
    uVar6 = (&__src[uVar15].m_sn)[1];
    pMVar7 = (MAP_VALUE *)(&__src[uVar15].m_next + 1);
    OVar11 = pMVar7->m_u_type;
    OVar8 = pMVar7->m_u32;
    __src->m_next = __src[uVar15].m_next;
    (__src->m_value).m_u_type = OVar11;
    (__src->m_value).m_u32 = OVar8;
    __src->m_sn = OVar4;
    *(undefined8 *)&__src->m_sn_active = uVar6;
    (__src->m_id).Data1 = uVar2;
    (__src->m_id).Data2 = uVar9;
    (__src->m_id).Data3 = uVar10;
    *(undefined8 *)(__src->m_id).Data4 = uVar5;
    __src = __src + 1;
  }
  src->m_count = (ON__UINT32)lVar12;
  if (lVar12 == 0) {
    src->m_count = 0;
    src->m_purged = 0;
    src->m_sorted = 1;
    src->m_sn0 = 0;
    src->m_sn1 = 0;
  }
  else if (src->m_sorted != 0) {
    src->m_sn0 = src->m_sn[0].m_sn;
  }
  return (ulong)uVar13;
}

Assistant:

ON__UINT64 ON_SerialNumberMap::GarbageCollectMoveHelper(ON_SN_BLOCK* dst,ON_SN_BLOCK* src)
{
  // This helper is used by GarbageCollectHelper and moves
  // as many entries as possible from src to dst.  
  // Returns: the number of entries transferred.
  ON__UINT32 i,j,n;
  if ( src && dst )
  {
    n = ON_SN_BLOCK::SN_BLOCK_CAPACITY - dst->m_count;
    if ( src->m_count < n )
      n = src->m_count;
    if ( n > 0 )
    {
      if ( 0 == dst->m_count )
      {
        dst->EmptyBlock();
      }
      if ( 0 == src->m_sorted )
      {
        dst->m_sorted = 0;
        if ( 0 == dst->m_count )
        {
          dst->m_sn0 = src->m_sn0;
          dst->m_sn1 = src->m_sn1;
        }
      }
      memcpy(&dst->m_sn[dst->m_count],&src->m_sn[0],(size_t)(n*sizeof(src->m_sn[0])));
      dst->m_count += n;
      if ( dst->m_sorted )
      {
        dst->m_sn0 = dst->m_sn[0].m_sn; // set m_sn0 because input dst could have count 0
        dst->m_sn1 = dst->m_sn[dst->m_count-1].m_sn;
      }
      else 
      {
        if ( dst->m_sn0 > src->m_sn0 )
          dst->m_sn0 = src->m_sn0;
        if ( dst->m_sn1 < src->m_sn1 )
          dst->m_sn1 = src->m_sn1;
      }
      i = 0; j = n;
      while ( j < src->m_count )
      {
        src->m_sn[i++] = src->m_sn[j++];
      }
      src->m_count = i;
      if ( src->m_count > 0 )
      {
        if ( src->m_sorted )
          src->m_sn0 = src->m_sn[0].m_sn;
      }
      else
      {
        src->EmptyBlock();
      }
    }
  }
  else
  {
    n = 0;
  }
  return n;
}